

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

pair<unsigned_long,_unsigned_long> __thiscall
poly::
vector<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>,_poly::delegate_cloning_policy<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>,_std::integral_constant<bool,_true>_>_>
::calculate_storage_size
          (vector<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>,_poly::delegate_cloning_policy<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>,_std::integral_constant<bool,_true>_>_>
           *this,size_t new_size,size_t new_elem_size,size_t new_alignment)

{
  bool bVar1;
  unsigned_long *puVar2;
  elem_ptr_const_pointer __first;
  elem_ptr_const_pointer __last;
  long lVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  pair<unsigned_long,_unsigned_long> pVar7;
  unsigned_long local_c0;
  ulong local_a0;
  unsigned_long local_80;
  unsigned_long size;
  size_t num_of_new_obj;
  unsigned_long avg_obj_size;
  unsigned_long local_60;
  unsigned_long buffer_size;
  unsigned_long new_object_size;
  unsigned_long initial_alignment_buffer;
  anon_class_8_1_44ed32e8 local_40;
  unsigned_long max_alignment;
  size_t new_alignment_local;
  size_t new_elem_size_local;
  size_t new_size_local;
  vector<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>,_poly::delegate_cloning_policy<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>,_std::integral_constant<bool,_true>_>_>
  *this_local;
  
  max_alignment = new_alignment;
  new_alignment_local = new_elem_size;
  new_elem_size_local = new_size;
  new_size_local = (size_t)this;
  initial_alignment_buffer = max_align(this);
  puVar2 = Catch::clara::std::max<unsigned_long>(&max_alignment,&initial_alignment_buffer);
  new_object_size = *puVar2;
  buffer_size = (((new_alignment_local - 1) + new_object_size) / new_object_size) * new_object_size;
  local_40.max_alignment = new_object_size;
  __first = begin_elem(this);
  __last = end_elem(this);
  avg_obj_size = local_40.max_alignment;
  local_60 = std::
             accumulate<poly::vector_elem_ptr<poly::delegate_cloning_policy<Interface,custom::Allocator<Interface,custom::AllocatorDescriptor<std::integral_constant<bool,false>,std::integral_constant<bool,true>,std::integral_constant<bool,false>,std::integral_constant<bool,true>,std::integral_constant<bool,true>>>,std::integral_constant<bool,true>>,std::allocator_traits<custom::Allocator<Interface,custom::AllocatorDescriptor<std::integral_constant<bool,false>,std::integral_constant<bool,true>,std::integral_constant<bool,false>,std::integral_constant<bool,true>,std::integral_constant<bool,true>>>>>const*,unsigned_long,poly::vector<Interface,custom::Allocator<Interface,custom::AllocatorDescriptor<std::integral_constant<bool,false>,std::integral_constant<bool,true>,std::integral_constant<bool,false>,std::integral_constant<bool,true>,std::integral_constant<bool,true>>>,poly::delegate_cloning_policy<Interface,custom::Allocator<Interface,custom::AllocatorDescriptor<std::integral_constant<bool,false>,std::integral_constant<bool,true>,std::integral_constant<bool,false>,std::integral_constant<bool,true>,std::integral_constant<bool,true>>>,std::integral_constant<bool,true>>>::calculate_storage_size(unsigned_long,unsigned_long,unsigned_long)const::_lambda(unsigned_long,auto:1_const&)_1_>
                       (__first,__last,new_object_size,local_40);
  bVar1 = empty(this);
  if (bVar1) {
    local_a0 = buffer_size;
  }
  else {
    lVar3 = local_60 + buffer_size;
    sVar4 = vector<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>,_poly::delegate_cloning_policy<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>,_std::integral_constant<bool,_true>_>_>
            ::size(this);
    sVar5 = vector<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>,_poly::delegate_cloning_policy<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>,_std::integral_constant<bool,_true>_>_>
            ::size(this);
    local_a0 = (lVar3 + sVar4) / (sVar5 + 1);
  }
  sVar4 = new_elem_size_local;
  num_of_new_obj = local_a0;
  sVar6 = vector<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>,_poly::delegate_cloning_policy<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>,_std::integral_constant<bool,_true>_>_>
          ::size(this);
  sVar5 = new_elem_size_local;
  if (sVar4 < sVar6) {
    local_c0 = 0;
  }
  else {
    sVar4 = vector<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>,_poly::delegate_cloning_policy<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>,_std::integral_constant<bool,_true>_>_>
            ::size(this);
    local_c0 = sVar5 - sVar4;
  }
  size = local_c0;
  local_80 = local_60 + new_elem_size_local * 0x28 + buffer_size + local_c0 * num_of_new_obj;
  pVar7 = std::make_pair<unsigned_long&,unsigned_long_const&>(&local_80,&local_40.max_alignment);
  return pVar7;
}

Assistant:

inline std::pair<size_t, size_t> vector<I, A, C>::calculate_storage_size(
    size_t new_size, size_t new_elem_size, size_t new_alignment) const noexcept
{
    const auto max_alignment            = std::max(new_alignment, max_align());
    const auto initial_alignment_buffer = max_alignment;
    const auto new_object_size
        = ((new_elem_size + max_alignment - 1) / max_alignment) * max_alignment;
    const auto buffer_size = std::accumulate(begin_elem(), end_elem(), initial_alignment_buffer,
        [max_alignment](size_t val, const auto& p) {
            return val + ((p.size() + max_alignment - 1) / max_alignment) * max_alignment;
        });
    auto       avg_obj_size
        = !empty() ? (buffer_size + new_object_size + size()) / (size() + 1) : new_object_size;
    auto num_of_new_obj = new_size >= size() ? (new_size - size()) : 0U;
    auto size           = new_size * sizeof(elem_ptr) + // storage for ptrs
        buffer_size + // storage for existing elems w initial alignment
        new_object_size + // storage for the new elem
        (num_of_new_obj * avg_obj_size); // estimated storage for new elems
    return std::make_pair(size, max_alignment);
}